

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentInvoker.h
# Opt level: O0

void __thiscall
aeron::concurrent::AgentInvoker<aeron::ClientConductor>::start
          (AgentInvoker<aeron::ClientConductor> *this)

{
  undefined8 *in_RDI;
  SourcedException *exception;
  
  if ((*(byte *)(in_RDI + 2) & 1) == 0) {
    *(undefined1 *)(in_RDI + 2) = 1;
    ClientConductor::onStart((ClientConductor *)*in_RDI);
    *(undefined1 *)((long)in_RDI + 0x11) = 1;
  }
  return;
}

Assistant:

inline void start()
    {
        try
        {
            if (!m_isStarted)
            {
                m_isStarted = true;
                m_agent.onStart();
                m_isRunning = true;
            }
        }
        catch (const util::SourcedException &exception)
        {
            m_exceptionHandler(exception);
            close();
        }
    }